

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_NtkPowerTest(void)

{
  word local_20;
  word t;
  int n;
  int k;
  int j;
  int i;
  
  t._0_4_ = 4;
  for (k = 0; k < 1 << ((byte)(int)t & 0x1f); k = k + 1) {
    for (n = 0; n < 1 << ((byte)(int)t & 0x1f); n = n + 1) {
      local_20 = (word)k;
      for (t._4_4_ = 1; t._4_4_ < n; t._4_4_ = t._4_4_ + 1) {
        local_20 = (long)k * local_20;
      }
      Extra_NtkPrintBin((word *)&k,(int)t);
      Extra_NtkPrintBin((word *)&n,(int)t);
      printf(" ");
      Extra_NtkPrintBin(&local_20,0x40);
      printf("\n");
    }
  }
  return;
}

Assistant:

void Extra_NtkPowerTest()
{
    int i, j, k, n = 4;
    for ( i = 0; i < (1<<n); i++ )
    for ( j = 0; j < (1<<n); j++ )
    {
        word t = (word)i;
        for ( k = 1; k < j; k++ )
            t *= (word)i;
        Extra_NtkPrintBin( (word *)&i, n );
        Extra_NtkPrintBin( (word *)&j, n );
        printf( " " );
        Extra_NtkPrintBin( (word *)&t, 64 );
        printf( "\n" );
    }
}